

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O2

void __thiscall Plane::Plane(Plane *this,double a,double b,double c,double d)

{
  double v;
  
  GeometricObject::GeometricObject(&this->super_GeometricObject);
  (this->super_GeometricObject)._vptr_GeometricObject = (_func_int **)&PTR__GeometricObject_00109bd0
  ;
  (this->normal).x = a;
  (this->normal).y = b;
  (this->normal).z = c;
  v = SQRT(c * c + a * a + b * b);
  Vector::operator/=(&this->normal,v);
  this->dist = d / v;
  return;
}

Assistant:

Plane::Plane( double a, double b, double c,  double d )
{
   normal = Vector(a,b,c);
   double norm = !normal;

   normal /= norm;
   dist = d / norm;
}